

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_mp3_seek_to_pcm_frame(ma_dr_mp3 *pMP3,ma_uint64 frameIndex)

{
  ma_dr_mp3_seek_proc p_Var1;
  ma_dr_mp3_seek_point *pmVar2;
  ulong uVar3;
  ma_bool32 mVar4;
  ma_uint32 mVar5;
  ma_uint64 mVar6;
  uint uVar7;
  ma_uint8 *pPCMFrames;
  ma_uint64 *pmVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  ulong local_38;
  
  if ((pMP3 == (ma_dr_mp3 *)0x0) || (p_Var1 = pMP3->onSeek, p_Var1 == (ma_dr_mp3_seek_proc)0x0)) {
LAB_0016d531:
    bVar12 = false;
    goto LAB_0016d534;
  }
  if (frameIndex == 0) {
    bVar12 = false;
    mVar4 = (*p_Var1)(pMP3->pUserData,0,ma_dr_mp3_seek_origin_start);
    if (mVar4 != 0) {
      pMP3->pcmFramesConsumedInMP3Frame = 0;
      pMP3->pcmFramesRemainingInMP3Frame = 0;
      pMP3->dataSize = 0;
      pMP3->currentPCMFrame = 0;
      pMP3->streamCursor = 0;
      pMP3->field_0x3ea0 = pMP3->field_0x3ea0 & 0xfe;
      (pMP3->decoder).header[0] = '\0';
      bVar12 = true;
    }
    goto LAB_0016d534;
  }
  pmVar2 = pMP3->pSeekPoints;
  if ((pmVar2 == (ma_dr_mp3_seek_point *)0x0) || (uVar11 = (ulong)pMP3->seekPointCount, uVar11 == 0)
     ) {
    local_38 = pMP3->currentPCMFrame;
    bVar12 = true;
    if (local_38 == frameIndex) goto LAB_0016d534;
    if (frameIndex < local_38) {
      bVar12 = false;
      mVar4 = (*p_Var1)(pMP3->pUserData,0,ma_dr_mp3_seek_origin_start);
      if (mVar4 == 0) goto LAB_0016d534;
      local_38 = 0;
      pMP3->pcmFramesConsumedInMP3Frame = 0;
      pMP3->pcmFramesRemainingInMP3Frame = 0;
      pMP3->dataSize = 0;
      pMP3->currentPCMFrame = 0;
      pMP3->streamCursor = 0;
      pMP3->field_0x3ea0 = pMP3->field_0x3ea0 & 0xfe;
      (pMP3->decoder).header[0] = '\0';
    }
  }
  else {
    if (frameIndex < pmVar2->pcmFrameIndex) {
      local_38 = 0;
      uVar11 = 0;
      mVar6 = 0;
      uVar7 = 0;
LAB_0016d404:
      bVar12 = false;
      mVar4 = (*p_Var1)(pMP3->pUserData,(int)uVar11,ma_dr_mp3_seek_origin_start);
      if (mVar4 == 0) goto LAB_0016d534;
      pMP3->streamCursor = uVar11;
    }
    else {
      pmVar8 = &pmVar2[1].pcmFrameIndex;
      uVar9 = 0xffffffffffffffff;
      do {
        uVar10 = uVar11 - 1;
        if ((1 - uVar11) + uVar9 == -1) break;
        uVar10 = uVar9 + 1;
        uVar3 = *pmVar8;
        pmVar8 = pmVar8 + 3;
        uVar9 = uVar10;
      } while (uVar3 <= frameIndex);
      uVar10 = uVar10 & 0xffffffff;
      uVar11 = pmVar2[uVar10].seekPosInBytes;
      mVar6 = pmVar2[uVar10].pcmFrameIndex;
      uVar7 = (uint)pmVar2[uVar10].mp3FramesToDiscard;
      local_38 = (ulong)pmVar2[uVar10].pcmFramesToDiscard;
      if (uVar11 < 0x80000000) goto LAB_0016d404;
      bVar12 = false;
      mVar4 = (*p_Var1)(pMP3->pUserData,0x7fffffff,ma_dr_mp3_seek_origin_start);
      if (mVar4 == 0) goto LAB_0016d534;
      pMP3->streamCursor = 0x7fffffff;
      while (uVar11 = uVar11 - 0x7fffffff, 0x7fffffff < uVar11) {
        mVar4 = (*pMP3->onSeek)(pMP3->pUserData,0x7fffffff,ma_dr_mp3_seek_origin_current);
        if (mVar4 == 0) goto LAB_0016d531;
        pMP3->streamCursor = pMP3->streamCursor + 0x7fffffff;
      }
      mVar4 = (*pMP3->onSeek)(pMP3->pUserData,(int)uVar11,ma_dr_mp3_seek_origin_current);
      if (mVar4 == 0) goto LAB_0016d531;
      pMP3->streamCursor = pMP3->streamCursor + uVar11;
    }
    pMP3->pcmFramesConsumedInMP3Frame = 0;
    pMP3->pcmFramesRemainingInMP3Frame = 0;
    pMP3->currentPCMFrame = 0;
    pMP3->dataSize = 0;
    pMP3->field_0x3ea0 = pMP3->field_0x3ea0 & 0xfe;
    (pMP3->decoder).header[0] = '\0';
    if (uVar7 != 0) {
      do {
        bVar12 = false;
        pPCMFrames = (ma_uint8 *)0x0;
        if (uVar7 == 1) {
          pPCMFrames = pMP3->pcmFrames;
        }
        mVar5 = ma_dr_mp3_decode_next_frame_ex(pMP3,(ma_dr_mp3d_sample_t *)pPCMFrames);
        if (mVar5 == 0) goto LAB_0016d534;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    local_38 = mVar6 - local_38;
    pMP3->currentPCMFrame = local_38;
  }
  if (pMP3->onRead == (ma_dr_mp3_read_proc)0x0) {
    mVar6 = 0;
  }
  else {
    mVar6 = ma_dr_mp3_read_pcm_frames_raw(pMP3,frameIndex - local_38,(void *)0x0);
  }
  bVar12 = mVar6 == frameIndex - local_38;
LAB_0016d534:
  return (ma_bool32)bVar12;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_seek_to_pcm_frame(ma_dr_mp3* pMP3, ma_uint64 frameIndex)
{
    if (pMP3 == NULL || pMP3->onSeek == NULL) {
        return MA_FALSE;
    }
    if (frameIndex == 0) {
        return ma_dr_mp3_seek_to_start_of_stream(pMP3);
    }
    if (pMP3->pSeekPoints != NULL && pMP3->seekPointCount > 0) {
        return ma_dr_mp3_seek_to_pcm_frame__seek_table(pMP3, frameIndex);
    } else {
        return ma_dr_mp3_seek_to_pcm_frame__brute_force(pMP3, frameIndex);
    }
}